

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int Curl_poll(pollfd *ufds,uint nfds,int timeout_ms)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  timeval tVar5;
  timeval newer;
  __time_t local_58;
  __suseconds_t local_50;
  int local_44;
  int r;
  int error;
  int pending_ms;
  uint i;
  _Bool fds_none;
  timeval initial_tv;
  int timeout_ms_local;
  uint nfds_local;
  pollfd *ufds_local;
  
  initial_tv.tv_usec._0_4_ = timeout_ms;
  initial_tv.tv_usec._4_4_ = nfds;
  memset(&i,0,0x10);
  bVar1 = true;
  r = 0;
  if (ufds != (pollfd *)0x0) {
    for (error = 0; (uint)error < initial_tv.tv_usec._4_4_; error = error + 1) {
      if (ufds[(uint)error].fd != -1) {
        bVar1 = false;
        break;
      }
    }
  }
  if (bVar1) {
    ufds_local._4_4_ = Curl_wait_ms((int)initial_tv.tv_usec);
  }
  else {
    if (0 < (int)initial_tv.tv_usec) {
      r = (int)initial_tv.tv_usec;
      tVar5 = curlx_tvnow();
      local_58 = tVar5.tv_sec;
      _i = local_58;
      local_50 = tVar5.tv_usec;
      initial_tv.tv_sec = local_50;
    }
    do {
      do {
        if ((int)initial_tv.tv_usec < 0) {
          r = -1;
        }
        else if ((int)initial_tv.tv_usec == 0) {
          r = 0;
        }
        local_44 = poll((pollfd *)ufds,(ulong)initial_tv.tv_usec._4_4_,r);
        if (local_44 != -1) goto LAB_008ebd6d;
        piVar3 = __errno_location();
        iVar2 = (int)initial_tv.tv_usec;
        if ((*piVar3 != 0) && ((Curl_ack_eintr != 0 || (*piVar3 != 4)))) goto LAB_008ebd6d;
      } while ((int)initial_tv.tv_usec < 1);
      newer = curlx_tvnow();
      tVar5.tv_usec = initial_tv.tv_sec;
      tVar5.tv_sec = _i;
      lVar4 = curlx_tvdiff(newer,tVar5);
      r = iVar2 - (int)lVar4;
    } while (0 < r);
    local_44 = 0;
LAB_008ebd6d:
    if (local_44 < 0) {
      ufds_local._4_4_ = -1;
    }
    else if (local_44 == 0) {
      ufds_local._4_4_ = 0;
    }
    else {
      for (error = 0; (uint)error < initial_tv.tv_usec._4_4_; error = error + 1) {
        if (ufds[(uint)error].fd != -1) {
          if ((ufds[(uint)error].revents & 0x10U) != 0) {
            ufds[(uint)error].revents = ufds[(uint)error].revents | 1;
          }
          if ((ufds[(uint)error].revents & 8U) != 0) {
            ufds[(uint)error].revents = ufds[(uint)error].revents | 5;
          }
        }
      }
      ufds_local._4_4_ = local_44;
    }
  }
  return ufds_local._4_4_;
}

Assistant:

int Curl_poll(struct pollfd ufds[], unsigned int nfds, int timeout_ms)
{
#ifndef HAVE_POLL_FINE
  struct timeval pending_tv;
  struct timeval *ptimeout;
  fd_set fds_read;
  fd_set fds_write;
  fd_set fds_err;
  curl_socket_t maxfd;
#endif
  struct timeval initial_tv = {0,0};
  bool fds_none = TRUE;
  unsigned int i;
  int pending_ms = 0;
  int error;
  int r;

  if(ufds) {
    for(i = 0; i < nfds; i++) {
      if(ufds[i].fd != CURL_SOCKET_BAD) {
        fds_none = FALSE;
        break;
      }
    }
  }
  if(fds_none) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }

  /* Avoid initial timestamp, avoid curlx_tvnow() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  if(timeout_ms > 0) {
    pending_ms = timeout_ms;
    initial_tv = curlx_tvnow();
  }

#ifdef HAVE_POLL_FINE

  do {
    if(timeout_ms < 0)
      pending_ms = -1;
    else if(!timeout_ms)
      pending_ms = 0;
    r = poll(ufds, nfds, pending_ms);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - elapsed_ms;
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  for(i = 0; i < nfds; i++) {
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(ufds[i].revents & POLLHUP)
      ufds[i].revents |= POLLIN;
    if(ufds[i].revents & POLLERR)
      ufds[i].revents |= (POLLIN|POLLOUT);
  }

#else  /* HAVE_POLL_FINE */

  FD_ZERO(&fds_read);
  FD_ZERO(&fds_write);
  FD_ZERO(&fds_err);
  maxfd = (curl_socket_t)-1;

  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    VERIFY_SOCK(ufds[i].fd);
    if(ufds[i].events & (POLLIN|POLLOUT|POLLPRI|
                          POLLRDNORM|POLLWRNORM|POLLRDBAND)) {
      if(ufds[i].fd > maxfd)
        maxfd = ufds[i].fd;
      if(ufds[i].events & (POLLRDNORM|POLLIN))
        FD_SET(ufds[i].fd, &fds_read);
      if(ufds[i].events & (POLLWRNORM|POLLOUT))
        FD_SET(ufds[i].fd, &fds_write);
      if(ufds[i].events & (POLLRDBAND|POLLPRI))
        FD_SET(ufds[i].fd, &fds_err);
    }
  }

#ifdef USE_WINSOCK
  /* WinSock select() can't handle zero events.  See the comment about this in
     Curl_check_socket(). */
  if(fds_read.fd_count == 0 && fds_write.fd_count == 0
     && fds_err.fd_count == 0) {
    r = Curl_wait_ms(timeout_ms);
    return r;
  }
#endif

  ptimeout = (timeout_ms < 0) ? NULL : &pending_tv;

  do {
    if(timeout_ms > 0) {
      pending_tv.tv_sec = pending_ms / 1000;
      pending_tv.tv_usec = (pending_ms % 1000) * 1000;
    }
    else if(!timeout_ms) {
      pending_tv.tv_sec = 0;
      pending_tv.tv_usec = 0;
    }
    r = select((int)maxfd + 1,
#ifndef USE_WINSOCK
               &fds_read, &fds_write, &fds_err,
#else
               /* WinSock select() can't handle fd_sets with zero bits set, so
                  don't give it such arguments.  See the comment about this in
                  Curl_check_socket().
               */
               fds_read.fd_count ? &fds_read : NULL,
               fds_write.fd_count ? &fds_write : NULL,
               fds_err.fd_count ? &fds_err : NULL,
#endif
               ptimeout);
    if(r != -1)
      break;
    error = SOCKERRNO;
    if(error && error_not_EINTR)
      break;
    if(timeout_ms > 0) {
      pending_ms = timeout_ms - elapsed_ms;
      if(pending_ms <= 0) {
        r = 0;  /* Simulate a "call timed out" case */
        break;
      }
    }
  } while(r == -1);

  if(r < 0)
    return -1;
  if(r == 0)
    return 0;

  r = 0;
  for(i = 0; i < nfds; i++) {
    ufds[i].revents = 0;
    if(ufds[i].fd == CURL_SOCKET_BAD)
      continue;
    if(FD_ISSET(ufds[i].fd, &fds_read))
      ufds[i].revents |= POLLIN;
    if(FD_ISSET(ufds[i].fd, &fds_write))
      ufds[i].revents |= POLLOUT;
    if(FD_ISSET(ufds[i].fd, &fds_err))
      ufds[i].revents |= POLLPRI;
    if(ufds[i].revents != 0)
      r++;
  }

#endif  /* HAVE_POLL_FINE */

  return r;
}